

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::InsertNoImplicitCallUses(GlobOpt *this,Instr *instr)

{
  int index;
  int iVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  undefined4 *puVar6;
  OpndList *pOVar7;
  Instr *this_00;
  PragmaInstr *this_01;
  Type *ppOVar8;
  Opnd *pOVar9;
  int index_00;
  
  pOVar7 = this->noImplicitCallUsesToInsert;
  if (pOVar7 == (OpndList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3536,"(noImplicitCallUsesToInsert)","noImplicitCallUsesToInsert");
    if (!bVar4) {
LAB_0044abae:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    pOVar7 = this->noImplicitCallUsesToInsert;
  }
  iVar1 = (pOVar7->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).count
  ;
  if (iVar1 != 0) {
    this_00 = IR::Instr::GetInsertBeforeByteCodeUsesInstr(instr);
    if (0 < iVar1) {
      index_00 = 0;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        this_01 = IR::PragmaInstr::New(NoImplicitCallUses,0,instr->m_func);
        ppOVar8 = JsUtil::
                  List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->noImplicitCallUsesToInsert,index_00);
        pOVar9 = *ppOVar8;
        if ((this_01->super_Instr).m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar4) goto LAB_0044abae;
          *puVar6 = 0;
        }
        pFVar2 = (this_01->super_Instr).m_func;
        if (pOVar9->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar4) goto LAB_0044abae;
          *puVar6 = 0;
        }
        bVar5 = pOVar9->field_0xb;
        if ((bVar5 & 2) != 0) {
          pOVar9 = IR::Opnd::Copy(pOVar9,pFVar2);
          bVar5 = pOVar9->field_0xb;
        }
        pOVar9->field_0xb = bVar5 | 2;
        (this_01->super_Instr).m_src1 = pOVar9;
        IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
        index = index_00 + 1;
        if (index < iVar1) {
          ppOVar8 = JsUtil::
                    List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this->noImplicitCallUsesToInsert,index);
          pOVar9 = *ppOVar8;
          if ((this_01->super_Instr).m_src2 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar4) goto LAB_0044abae;
            *puVar6 = 0;
          }
          pFVar2 = (this_01->super_Instr).m_func;
          if (pOVar9->isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar4) goto LAB_0044abae;
            *puVar6 = 0;
          }
          bVar5 = pOVar9->field_0xb;
          if ((bVar5 & 2) != 0) {
            pOVar9 = IR::Opnd::Copy(pOVar9,pFVar2);
            bVar5 = pOVar9->field_0xb;
          }
          pOVar9->field_0xb = bVar5 | 2;
          (this_01->super_Instr).m_src2 = pOVar9;
          IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
          index = index_00 + 2;
        }
        index_00 = index;
        IR::Instr::SetByteCodeOffset(&this_01->super_Instr,instr);
        IR::Instr::InsertBefore(this_00,&this_01->super_Instr);
      } while (index_00 < iVar1);
    }
    (this->noImplicitCallUsesToInsert->
    super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).count = 0;
  }
  return;
}

Assistant:

void
GlobOpt::InsertNoImplicitCallUses(IR::Instr *const instr)
{
    Assert(noImplicitCallUsesToInsert);

    const int n = noImplicitCallUsesToInsert->Count();
    if(n == 0)
    {
        return;
    }

    IR::Instr *const insertBeforeInstr = instr->GetInsertBeforeByteCodeUsesInstr();
    for(int i = 0; i < n;)
    {
        IR::Instr *const noImplicitCallUses = IR::PragmaInstr::New(Js::OpCode::NoImplicitCallUses, 0, instr->m_func);
        noImplicitCallUses->SetSrc1(noImplicitCallUsesToInsert->Item(i));
        noImplicitCallUses->GetSrc1()->SetIsJITOptimizedReg(true);
        ++i;
        if(i < n)
        {
            noImplicitCallUses->SetSrc2(noImplicitCallUsesToInsert->Item(i));
            noImplicitCallUses->GetSrc2()->SetIsJITOptimizedReg(true);
            ++i;
        }
        noImplicitCallUses->SetByteCodeOffset(instr);
        insertBeforeInstr->InsertBefore(noImplicitCallUses);
    }
    noImplicitCallUsesToInsert->Clear();
}